

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintdecode.c
# Opt level: O0

size_t read_intsAVX2(uint8_t *in,uint32_t *out,int length)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int ints_read;
  int count;
  size_t consumed;
  int *in_stack_000001d0;
  uint32_t *in_stack_000001d8;
  uint8_t *in_stack_000001e0;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_20;
  
  local_20 = 0;
  for (local_24 = 0; local_24 + 0xf < in_EDX; local_24 = local_28 + local_24) {
    iVar1 = read_int_groupAVX2(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    local_20 = (long)iVar1 + local_20;
  }
  for (; local_24 < in_EDX; local_24 = local_24 + 1) {
    iVar1 = read_int((uint8_t *)(in_RDI + local_20),(uint32_t *)(in_RSI + (long)local_24 * 4));
    local_20 = (long)iVar1 + local_20;
  }
  return local_20;
}

Assistant:

size_t read_intsAVX2(const uint8_t *in, uint32_t *out, int length) {
  size_t consumed = 0;
  int count;
  for (count = 0; count + 15 < length;) {
    int ints_read;
    consumed += read_int_groupAVX2(in + consumed, out + count, &ints_read);
    count += ints_read;
  }
  for (; count < length; count++) {
    consumed += read_int(in + consumed, out + count);
  }
  return consumed;
}